

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O3

void __thiscall
llama_kv_cache_unified::seq_div
          (llama_kv_cache_unified *this,llama_seq_id seq_id,llama_pos p0,llama_pos p1,int d)

{
  pointer plVar1;
  int iVar2;
  uint uVar3;
  pointer plVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  long lVar7;
  _Base_ptr p_Var8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  
  if (d != 1) {
    iVar9 = 0;
    if (0 < p0) {
      iVar9 = p0;
    }
    iVar10 = 0x7fffffff;
    if ((uint)p1 < 0x7fffffff) {
      iVar10 = p1;
    }
    if (iVar9 != iVar10) {
      if (this->recurrent == false) {
        uVar3 = this->size;
        if ((ulong)uVar3 != 0) {
          plVar4 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            p_Var5 = *(_Base_ptr *)((long)&plVar4[uVar11].seq_id._M_t._M_impl + 0x10);
            if (p_Var5 != (_Base_ptr)0x0) {
              plVar1 = plVar4 + uVar11;
              p_Var8 = (_Base_ptr)((long)&plVar4[uVar11].seq_id._M_t._M_impl + 8);
              p_Var6 = p_Var8;
              do {
                if (seq_id <= (int)p_Var5[1]._M_color) {
                  p_Var6 = p_Var5;
                }
                p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < seq_id];
              } while (p_Var5 != (_Base_ptr)0x0);
              if (((p_Var6 != p_Var8) && ((int)p_Var6[1]._M_color <= seq_id)) &&
                 (iVar2 = plVar1->pos, iVar2 < iVar10 && iVar9 <= iVar2)) {
                this->has_shift = true;
                plVar1->pos = iVar2 / d;
                plVar1->delta = plVar1->delta + (iVar2 / d - iVar2);
              }
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar3);
        }
      }
      else if ((-1 < seq_id) && ((uint)seq_id < this->size)) {
        plVar4 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)plVar4[(uint)seq_id].tail;
        if (-1 < lVar7) {
          p_Var5 = *(_Base_ptr *)((long)&plVar4[lVar7].seq_id._M_t._M_impl + 0x10);
          if (p_Var5 != (_Base_ptr)0x0) {
            p_Var8 = (_Base_ptr)((long)&plVar4[lVar7].seq_id._M_t._M_impl + 8);
            p_Var6 = p_Var8;
            do {
              if (seq_id <= (int)p_Var5[1]._M_color) {
                p_Var6 = p_Var5;
              }
              p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < seq_id];
            } while (p_Var5 != (_Base_ptr)0x0);
            if (((p_Var6 != p_Var8) && ((int)p_Var6[1]._M_color <= seq_id)) &&
               (iVar2 = plVar4[lVar7].pos, iVar2 < iVar10 && iVar9 <= iVar2)) {
              plVar4[lVar7].pos = iVar2 / d;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llama_kv_cache_unified::seq_div(llama_seq_id seq_id, llama_pos p0, llama_pos p1, int d) {
    if (d == 1) {
        return;
    }

    if (p0 < 0) {
        p0 = 0;
    }

    if (p1 < 0) {
        p1 = std::numeric_limits<llama_pos>::max();
    }

    // If there is no range then return early to avoid looping over the cache.
    if (p0 == p1) {
        return;
    }

    if (recurrent) {
        // for Mamba-like or RWKV models, only the pos needs to be changed
        if (0 <= seq_id && seq_id < (int64_t) size) {
            const int32_t tail_id = cells[seq_id].tail;
            if (tail_id >= 0) {
                llama_kv_cell & cell = cells[tail_id];
                if (cell.has_seq_id(seq_id) && p0 <= cell.pos && cell.pos < p1) {
                    cell.pos /= d;
                }
            }
        }

        return;
    }

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id) && cells[i].pos >= p0 && cells[i].pos < p1) {
            has_shift = true;

            {
                llama_pos p_old = cells[i].pos;
                cells[i].pos   /= d;
                cells[i].delta += cells[i].pos - p_old;
            }
        }
    }
}